

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O3

void __thiscall
sglr::GLContext::bindFramebuffer(GLContext *this,deUint32 target,deUint32 framebuffer)

{
  GLuint framebuffer_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestError *this_00;
  int iVar2;
  int iVar3;
  uint local_24;
  
  framebuffer_00 = (*this->m_context->_vptr_RenderContext[6])();
  if (framebuffer_00 == framebuffer && framebuffer != 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"framebuffer == 0 || framebuffer != defaultFbo",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrGLContext.cpp"
               ,0xc6);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if ((1 < target - 0x8ca8) && (target != 0x8d40)) goto LAB_018abb85;
  if (framebuffer != 0) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&this->m_allocatedFbos,&local_24);
  }
  if (target == 0x8ca8) {
LAB_018abb58:
    this->m_readFramebufferBinding = framebuffer;
    if ((target != 0x8d40) && (target != 0x8ca9)) goto LAB_018abb85;
  }
  else if (target != 0x8ca9) {
    if (target != 0x8d40) goto LAB_018abb85;
    goto LAB_018abb58;
  }
  this->m_drawFramebufferBinding = framebuffer;
LAB_018abb85:
  if (framebuffer != 0) {
    framebuffer_00 = framebuffer;
  }
  glu::CallLogWrapper::glBindFramebuffer(this->m_wrapper,target,framebuffer_00);
  if ((target == 0x8d40) || (target == 0x8ca9)) {
    iVar2 = 0;
    iVar3 = 0;
    if (this->m_drawFramebufferBinding == 0) {
      iVar2 = (this->m_baseViewport).m_data[0];
      iVar3 = (this->m_baseViewport).m_data[1];
    }
    iVar1 = (*this->m_context->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1a00))
              ((this->m_curViewport).m_data[0] + iVar2,(this->m_curViewport).m_data[1] + iVar3,
               (this->m_curViewport).m_data[2],(this->m_curViewport).m_data[3]);
    iVar1 = (*this->m_context->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x1290))
              (iVar2 + (this->m_curScissor).m_data[0],iVar3 + (this->m_curScissor).m_data[1],
               (this->m_curScissor).m_data[2],(this->m_curScissor).m_data[3]);
  }
  return;
}

Assistant:

void GLContext::bindFramebuffer (deUint32 target, deUint32 framebuffer)
{
	// \todo [2011-10-13 pyry] This is a bit of a hack since test cases assumes 0 default fbo.
	deUint32 defaultFbo = m_context.getDefaultFramebuffer();
	TCU_CHECK(framebuffer == 0 || framebuffer != defaultFbo);

	bool isValidTarget = target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER || target == GL_READ_FRAMEBUFFER;

	if (isValidTarget && framebuffer != 0)
		m_allocatedFbos.insert(framebuffer);

	// Update bindings.
	if (target == GL_FRAMEBUFFER || target == GL_READ_FRAMEBUFFER)
		m_readFramebufferBinding = framebuffer;

	if (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER)
		m_drawFramebufferBinding = framebuffer;

	if (framebuffer == 0) // Redirect 0 to platform-defined default framebuffer.
		m_wrapper->glBindFramebuffer(target, defaultFbo);
	else
		m_wrapper->glBindFramebuffer(target, framebuffer);

	// Update viewport and scissor if we updated draw framebuffer binding \note Not logged for clarity
	if (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER)
	{
		tcu::IVec2 offset = getDrawOffset();
		m_context.getFunctions().viewport(m_curViewport.x()+offset.x(), m_curViewport.y()+offset.y(), m_curViewport.z(), m_curViewport.w());
		m_context.getFunctions().scissor(m_curScissor.x()+offset.x(), m_curScissor.y()+offset.y(), m_curScissor.z(), m_curScissor.w());
	}
}